

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::QuantizationParams::ByteSizeLong(QuantizationParams *this)

{
  bool bVar1;
  QuantizationTypeCase QVar2;
  int size;
  uint64_t uVar3;
  size_t sVar4;
  long lVar5;
  int cached_size;
  uint32_t cached_has_bits;
  size_t total_size;
  QuantizationParams *this_local;
  
  _cached_size = 0;
  uVar3 = _internal_numberofbits(this);
  if (uVar3 != 0) {
    uVar3 = _internal_numberofbits(this);
    _cached_size = google::protobuf::internal::WireFormatLite::UInt64SizePlusOne(uVar3);
  }
  QVar2 = QuantizationType_case(this);
  if (QVar2 != QUANTIZATIONTYPE_NOT_SET) {
    if (QVar2 == kLinearQuantization) {
      sVar4 = google::protobuf::internal::WireFormatLite::
              MessageSize<CoreML::Specification::LinearQuantizationParams>
                        ((this->QuantizationType_).linearquantization_);
      _cached_size = sVar4 + 2 + _cached_size;
    }
    else if (QVar2 == kLookupTableQuantization) {
      sVar4 = google::protobuf::internal::WireFormatLite::
              MessageSize<CoreML::Specification::LookUpTableQuantizationParams>
                        ((this->QuantizationType_).lookuptablequantization_);
      _cached_size = sVar4 + 2 + _cached_size;
    }
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar5 = std::__cxx11::string::size();
    _cached_size = lVar5 + _cached_size;
  }
  size = google::protobuf::internal::ToCachedSize(_cached_size);
  SetCachedSize(this,size);
  return _cached_size;
}

Assistant:

size_t QuantizationParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.QuantizationParams)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // uint64 numberOfBits = 1;
  if (this->_internal_numberofbits() != 0) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt64SizePlusOne(this->_internal_numberofbits());
  }

  switch (QuantizationType_case()) {
    // .CoreML.Specification.LinearQuantizationParams linearQuantization = 101;
    case kLinearQuantization: {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *QuantizationType_.linearquantization_);
      break;
    }
    // .CoreML.Specification.LookUpTableQuantizationParams lookupTableQuantization = 102;
    case kLookupTableQuantization: {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *QuantizationType_.lookuptablequantization_);
      break;
    }
    case QUANTIZATIONTYPE_NOT_SET: {
      break;
    }
  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}